

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void __thiscall lda::expdigammify(lda *this,vw *all,float *gamma)

{
  lda_math_mode lVar1;
  anon_class_8_2_969ef1a5 __unary_op;
  anon_class_8_2_969ef1a5 __unary_op_00;
  double dVar2;
  float fVar3;
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  float fVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  uint uVar14;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_39;
  undefined4 local_38;
  uint uStack_34;
  uint uStack_2c;
  undefined1 local_28 [16];
  
  lVar1 = this->mmode;
  if (lVar1 == USE_SIMD) {
    ldamath::vexpdigammify(all,gamma,1e-10);
    return;
  }
  if (lVar1 == USE_PRECISE) {
    if ((ulong)all->lda == 0) {
      dVar2 = 0.0;
    }
    else {
      fVar7 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)gamma + lVar6);
        lVar6 = lVar6 + 4;
      } while ((ulong)all->lda << 2 != lVar6);
      dVar2 = (double)fVar7;
    }
    dVar2 = boost::math::detail::
            digamma_imp<double,boost::integral_constant<int,24>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      (dVar2,(integral_constant<int,_24> *)0x0,&local_39);
    uVar8 = SUB84(dVar2,0);
    uVar9 = (uint)((ulong)dVar2 >> 0x20);
    fVar7 = 0.0;
    uVar13 = uVar8;
    uVar14 = uVar9 & 0x7fffffff;
    if (3.4028234663852886e+38 <= ABS(dVar2) && ABS(dVar2) != 3.4028234663852886e+38) {
      local_28._8_4_ = extraout_XMM0_Dc;
      local_28._0_8_ = dVar2;
      local_28._12_4_ = extraout_XMM0_Dd;
      local_38 = uVar8;
      uStack_34 = uVar9 & 0x7fffffff;
      uStack_2c = extraout_XMM0_Dd & 0x7fffffff;
      boost::math::policies::detail::raise_error<std::overflow_error,float>
                ("boost::math::digamma<%1%>(%1%)","numeric overflow");
      uVar8 = local_28._0_4_;
      uVar9 = local_28._4_4_;
      fVar7 = (float)local_28._0_8_;
      uVar13 = local_38;
      uVar14 = uStack_34;
    }
    if ((double)CONCAT44(uVar14,uVar13) < 3.4028234663852886e+38 ||
        (double)CONCAT44(uVar14,uVar13) == 3.4028234663852886e+38) {
      fVar7 = (float)(double)CONCAT44(uVar9,uVar8);
    }
    __unary_op.threshold = 1e-10;
    __unary_op.sum = fVar7;
    std::
    transform<float*,float*,ldamath::expdigammify<float,(lda_math_mode)1>(vw&,float*,float,float)::_lambda(float)_1_>
              (gamma,gamma + all->lda,gamma,__unary_op);
    return;
  }
  if (lVar1 != USE_FAST_APPROX) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "lda::expdigammify: Trampled or invalid math mode, aborting");
    std::endl<char,std::char_traits<char>>(poVar5);
    abort();
  }
  uVar4 = (ulong)all->lda;
  if (uVar4 == 0) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    lVar6 = 0;
    do {
      fVar7 = fVar7 + *(float *)((long)gamma + lVar6);
      lVar6 = lVar6 + 4;
    } while (uVar4 << 2 != lVar6);
  }
  fVar10 = fVar7 + 2.0;
  fVar3 = (float)((uint)fVar10 & 0x7fffff | 0x3f000000);
  auVar11._4_12_ = DAT_00272db0._4_12_;
  auVar11._0_4_ = fVar7 * 6.0 + 13.0;
  auVar12._4_4_ = fVar3 + 0.35208872;
  auVar12._0_4_ = fVar10 * 12.0 * fVar10;
  auVar12._8_8_ = 0;
  auVar12 = divps(auVar11,auVar12);
  __unary_op_00.threshold = 1e-10;
  __unary_op_00.sum =
       ((fVar3 * -1.4980303 + (float)(uint)fVar10 * 1.1920929e-07 + -124.22545) - auVar12._4_4_) *
       0.6931472 + (-(fVar7 + fVar7 + 1.0) / ((fVar7 + 1.0) * fVar7) - auVar12._0_4_);
  std::
  transform<float*,float*,ldamath::expdigammify<float,(lda_math_mode)2>(vw&,float*,float,float)::_lambda(float)_1_>
            (gamma,gamma + uVar4,gamma,__unary_op_00);
  return;
}

Assistant:

void lda::expdigammify(vw &all, float *gamma)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      ldamath::expdigammify<float, USE_FAST_APPROX>(all, gamma, underflow_threshold(), 0.0f);
      break;
    case USE_PRECISE:
      ldamath::expdigammify<float, USE_PRECISE>(all, gamma, underflow_threshold(), 0.0f);
      break;
    case USE_SIMD:
      ldamath::expdigammify<float, USE_SIMD>(all, gamma, underflow_threshold(), 0.0f);
      break;
    default:
      std::cerr << "lda::expdigammify: Trampled or invalid math mode, aborting" << std::endl;
      abort();
  }
}